

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu540c.c
# Opt level: O0

MPP_RET hal_h265e_v540c_gen_regs(void *hal,HalEncTask *task)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  H265eSyntax_new *syn_00;
  H265eV540cRegSet *regs_00;
  VepuFmtCfg *fmt_00;
  uint uVar5;
  hevc_vepu540c_base *regs_01;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  RK_U32 i_nal_type;
  RK_U32 *rdo_ckg;
  hevc_vepu540c_rc_roi *reg_klut;
  hevc_vepu540c_base *reg_base;
  hevc_vepu540c_control_cfg *reg_ctl;
  VepuFmtCfg *fmt;
  RK_S32 pic_h32;
  RK_S32 pic_wd32;
  RK_U32 pic_height_align8;
  RK_U32 pic_width_align8;
  H265eV540cRegSet *regs;
  H265eSyntax_new *syn;
  HalEncTask *enc_task;
  H265eV540cHalContext *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  syn_00 = (H265eSyntax_new *)(task->syntax).data;
  regs_00 = *(H265eV540cRegSet **)((long)hal + 0x70);
  fmt_00 = *(VepuFmtCfg **)((long)hal + 0x1d8);
  regs_01 = &regs_00->reg_base;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) enter\n",(char *)0x0,0x4b9);
  }
  uVar1 = (syn_00->pp).pic_width;
  uVar2 = (syn_00->pp).pic_height;
  uVar3 = (syn_00->pp).pic_width;
  uVar4 = (syn_00->pp).pic_height;
  if ((hal_h265e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","frame %d | type %d | start gen regs","hal_h265e_v540c_gen_regs",
               (ulong)*(uint *)((long)hal + 0x1b4),(ulong)*(uint *)((long)hal + 0x1ac));
  }
  memset(regs_00,0,0x1790);
  (regs_00->reg_ctl).reg0004_enc_strt =
       (anon_struct_4_3_aabe7823_for_reg0004_enc_strt)
       ((uint)(regs_00->reg_ctl).reg0004_enc_strt & 0xffffff00);
  (regs_00->reg_ctl).reg0004_enc_strt =
       (anon_struct_4_3_aabe7823_for_reg0004_enc_strt)
       ((uint)(regs_00->reg_ctl).reg0004_enc_strt & 0xfffff8ff |
       (*(uint *)((long)hal + 0x1c8) & 7) << 8);
  (regs_00->reg_ctl).reg0005_enc_clr =
       (anon_struct_4_3_e8f47264_for_reg0005_enc_clr)
       ((uint)(regs_00->reg_ctl).reg0005_enc_clr & 0xfffffffe);
  (regs_00->reg_ctl).reg0005_enc_clr =
       (anon_struct_4_3_e8f47264_for_reg0005_enc_clr)
       ((uint)(regs_00->reg_ctl).reg0005_enc_clr & 0xfffffffd);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xfffffffe | 1);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xfffffffd | 2);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xfffffffb | 4);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xfffffff7);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xffffffef | 0x10);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xffffffdf | 0x20);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xffffffbf | 0x40);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xffffff7f | 0x80);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xfffffeff | 0x100);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xfffffdff);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xfffffbff | 0x400);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xfffff7ff | 0x800);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xffffefff | 0x1000);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xffffdfff | 0x2000);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xffffbfff | 0x4000);
  (regs_00->reg_ctl).reg0008_int_en =
       (anon_struct_4_17_6dcd6e51_for_reg0008_int_en)
       ((uint)(regs_00->reg_ctl).reg0008_int_en & 0xffff7fff | 0x8000);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_8_ec00e75a_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xfffffff0);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_8_ec00e75a_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xffffff0f);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_8_ec00e75a_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xfffff0ff);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_8_ec00e75a_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xffff0fff | 0x7000);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_8_ec00e75a_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xfff0ffff);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_8_ec00e75a_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xff0fffff);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_8_ec00e75a_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xf0ffffff);
  (regs_00->reg_ctl).reg0012_dtrns_map =
       (anon_struct_4_8_ec00e75a_for_reg0012_dtrns_map)
       ((uint)(regs_00->reg_ctl).reg0012_dtrns_map & 0xfffffff);
  (regs_00->reg_ctl).reg0022_rdo_ckg = (anon_struct_4_26_47fc5869_for_reg0022_rdo_ckg)0xffffffff;
  (regs_00->reg_ctl).reg0013_dtrns_cfg =
       (anon_struct_4_3_17ae9c59_for_reg0013_dtrns_cfg)
       ((uint)(regs_00->reg_ctl).reg0013_dtrns_cfg & 0xfc00ffff);
  (regs_00->reg_ctl).reg0014_enc_wdg =
       (anon_struct_4_2_39a7de62_for_reg0014_enc_wdg)
       ((uint)(regs_00->reg_ctl).reg0014_enc_wdg & 0xff000000 | 0x1fffff);
  (regs_00->reg_ctl).reg0014_enc_wdg =
       (anon_struct_4_2_39a7de62_for_reg0014_enc_wdg)
       ((uint)(regs_00->reg_ctl).reg0014_enc_wdg & 0xffffff | 0xff000000);
  (regs_00->reg_ctl).reg0021_func_en =
       (anon_struct_4_6_0703440a_for_reg0021_func_en)
       ((uint)(regs_00->reg_ctl).reg0021_func_en & 0xfffffffe | 1);
  (regs_00->reg_ctl).reg0021_func_en =
       (anon_struct_4_6_0703440a_for_reg0021_func_en)
       ((uint)(regs_00->reg_ctl).reg0021_func_en & 0xfffffffd | 2);
  (regs_00->reg_ctl).reg0021_func_en =
       (anon_struct_4_6_0703440a_for_reg0021_func_en)
       ((uint)(regs_00->reg_ctl).reg0021_func_en & 0xfffffffb | 4);
  (regs_00->reg_base).reg0196_enc_rsl =
       (anon_struct_4_4_3b0f98d5_for_reg0196_enc_rsl)
       ((uint)(regs_00->reg_base).reg0196_enc_rsl & 0xfffff800 | (uVar1 + 7 >> 3) - 1 & 0x7ff);
  if (((syn_00->pp).pic_width & 7) == 0) {
    local_78 = 0;
  }
  else {
    local_78 = 8 - ((syn_00->pp).pic_width & 7);
  }
  (regs_00->reg_base).reg0197_src_fill =
       (anon_struct_4_4_c09dc813_for_reg0197_src_fill)
       ((uint)(regs_00->reg_base).reg0197_src_fill & 0xffffffc0 | local_78 & 0x3f);
  (regs_00->reg_base).reg0196_enc_rsl =
       (anon_struct_4_4_3b0f98d5_for_reg0196_enc_rsl)
       ((uint)(regs_00->reg_base).reg0196_enc_rsl & 0xf800ffff |
       ((uVar2 + 7 >> 3) - 1 & 0x7ff) << 0x10);
  if (((syn_00->pp).pic_height & 7) == 0) {
    local_7c = 0;
  }
  else {
    local_7c = 8 - ((syn_00->pp).pic_height & 7);
  }
  (regs_00->reg_base).reg0197_src_fill =
       (anon_struct_4_4_c09dc813_for_reg0197_src_fill)
       ((uint)(regs_00->reg_base).reg0197_src_fill & 0xffc0ffff | (local_7c & 0x3f) << 0x10);
  (regs_00->reg_base).reg0192_enc_pic =
       (anon_struct_4_11_d5ed75f1_for_reg0192_enc_pic)
       ((uint)(regs_00->reg_base).reg0192_enc_pic & 0xfffffffc | 1);
  (regs_00->reg_base).reg0192_enc_pic =
       (anon_struct_4_11_d5ed75f1_for_reg0192_enc_pic)
       ((uint)(regs_00->reg_base).reg0192_enc_pic & 0xfffffffb |
       (uint)((syn_00->sp).non_reference_flag == 0) << 2);
  (regs_00->reg_base).reg0192_enc_pic =
       (anon_struct_4_11_d5ed75f1_for_reg0192_enc_pic)
       ((uint)(regs_00->reg_base).reg0192_enc_pic & 0xffffffef | 0x10);
  uVar5 = mpp_ceil_log2(((uVar3 + 0x1f) / 0x20) * ((uVar4 + 0x1f) / 0x20));
  (regs_00->reg_base).reg0192_enc_pic =
       (anon_struct_4_11_d5ed75f1_for_reg0192_enc_pic)
       ((uint)(regs_00->reg_base).reg0192_enc_pic & 0xff07ffff | (uVar5 & 0x1f) << 0x13);
  (regs_00->reg_base).reg0203_src_proc =
       (anon_struct_4_4_881c966b_for_reg0203_src_proc)
       ((uint)(regs_00->reg_base).reg0203_src_proc & 0xfbffffff);
  (regs_00->reg_base).reg0203_src_proc =
       (anon_struct_4_4_881c966b_for_reg0203_src_proc)
       ((uint)(regs_00->reg_base).reg0203_src_proc & 0xe7ffffff);
  if (*(int *)((long)hal + 0x1ac) == 2) {
    local_80 = 6;
  }
  else {
    local_80 = 6;
    if (*(int *)(*(long *)((long)hal + 0x1c0) + 0x1864) == 1) {
      local_80 = 9;
    }
  }
  (regs_00->reg_rc_roi).klut_ofst =
       (anon_struct_4_4_05a3e16a_for_klut_ofst)
       ((uint)(regs_00->reg_rc_roi).klut_ofst & 0xfffffff0 | local_80);
  (regs_00->reg_rc_roi).klut_ofst =
       (anon_struct_4_4_05a3e16a_for_klut_ofst)
       ((uint)(regs_00->reg_rc_roi).klut_ofst & 0xffffc0ff | 0x400);
  (regs_00->reg_base).reg0248_sao_cfg =
       (anon_struct_4_2_3c92d8d8_for_reg0248_sao_cfg)
       ((uint)(regs_00->reg_base).reg0248_sao_cfg & 0xfffffff8 | 5);
  vepu540c_h265_set_me_regs((H265eV540cHalContext *)hal,syn_00,regs_01);
  (regs_00->reg_base).reg0232_rdo_cfg =
       (anon_struct_4_13_7fd20f56_for_reg0232_rdo_cfg)
       ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xfffffffb);
  (regs_00->reg_base).reg0232_rdo_cfg =
       (anon_struct_4_13_7fd20f56_for_reg0232_rdo_cfg)
       ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xffff8007 | 0x490);
  (regs_00->reg_base).reg0232_rdo_cfg =
       (anon_struct_4_13_7fd20f56_for_reg0232_rdo_cfg)
       ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xff87ffff | 0x700000);
  (regs_00->reg_base).reg0232_rdo_cfg =
       (anon_struct_4_13_7fd20f56_for_reg0232_rdo_cfg)
       ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xfbffffff | 0x4000000);
  (regs_00->reg_base).reg0232_rdo_cfg =
       (anon_struct_4_13_7fd20f56_for_reg0232_rdo_cfg)
       ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xf7ffffff | 0x8000000);
  (regs_00->reg_base).reg0232_rdo_cfg =
       (anon_struct_4_13_7fd20f56_for_reg0232_rdo_cfg)
       ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xefffffff | 0x10000000);
  (regs_00->reg_base).reg0232_rdo_cfg =
       (anon_struct_4_13_7fd20f56_for_reg0232_rdo_cfg)
       ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xdfffffff | 0x20000000);
  if ((syn_00->pp).num_long_term_ref_pics_sps == '\0') {
    (regs_00->reg_base).reg0232_rdo_cfg =
         (anon_struct_4_13_7fd20f56_for_reg0232_rdo_cfg)
         ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xfffffffe);
    (regs_00->reg_base).reg0232_rdo_cfg =
         (anon_struct_4_13_7fd20f56_for_reg0232_rdo_cfg)
         ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xfffffffd);
  }
  else {
    (regs_00->reg_base).reg0232_rdo_cfg =
         (anon_struct_4_13_7fd20f56_for_reg0232_rdo_cfg)
         ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xfffffffe);
    (regs_00->reg_base).reg0232_rdo_cfg =
         (anon_struct_4_13_7fd20f56_for_reg0232_rdo_cfg)
         ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xfffffffd | 2);
  }
  (regs_00->reg_base).reg0232_rdo_cfg =
       (anon_struct_4_13_7fd20f56_for_reg0232_rdo_cfg)
       ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xff7fffff | 0x800000);
  (regs_00->reg_base).reg0232_rdo_cfg =
       (anon_struct_4_13_7fd20f56_for_reg0232_rdo_cfg)
       ((uint)(regs_00->reg_base).reg0232_rdo_cfg & 0xfcffffff |
       ((syn_00->pp).field_21.CodingParamToolFlags & 1) << 0x18);
  if (*(int *)((long)hal + 0x1ac) == 2) {
    local_74 = 0x13;
  }
  else {
    local_74 = 1;
  }
  if ((syn_00->sp).temporal_id == 0) {
    local_84 = local_74;
  }
  else {
    local_84 = 3;
  }
  (regs_00->reg_base).reg0236_synt_nal =
       (anon_struct_4_2_8616aad8_for_reg0236_synt_nal)
       ((uint)(regs_00->reg_base).reg0236_synt_nal & 0xffffffc0 | local_84);
  vepu540c_h265_set_hw_address((H265eV540cHalContext *)hal,regs_01,task);
  vepu540c_h265_set_pp_regs(regs_00,fmt_00,(MppEncPrepCfg *)(*(long *)((long)hal + 0x1c0) + 8));
  vepu540c_h265_set_rc_regs((H265eV540cHalContext *)hal,regs_00,task);
  vepu540c_h265_set_slice_regs(syn_00,regs_01);
  vepu540c_h265_set_ref_regs(syn_00,regs_01);
  vepu540c_h265_set_patch_info(*(MppDev *)((long)hal + 0x68),syn_00,fmt_00->format,task);
  setup_vepu540c_ext_line_buf((H265eV540cHalContext *)hal,*(H265eV540cRegSet **)((long)hal + 0x70));
  vepu540c_h265_set_split
            (regs_00,*(MppEncCfgSet **)((long)hal + 0x1c0),
             (syn_00->pp).field_22.CodingSettingPicturePropertyFlags >> 7 & 1);
  if (*(long *)((long)hal + 0x1b8) != 0) {
    vepu540c_set_roi(&(regs_00->reg_rc_roi).roi_cfg,*(MppEncROICfg **)((long)hal + 0x1b8),
                     *(RK_S32 *)(*(long *)((long)hal + 0x1c0) + 0xc),
                     *(RK_S32 *)(*(long *)((long)hal + 0x1c0) + 0x10));
  }
  vepu540c_h265_global_cfg_set((H265eV540cHalContext *)hal,regs_00);
  *(int *)((long)hal + 500) = *(int *)((long)hal + 500) + 1;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) leave\n",(char *)0x0,0x53a);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_v540c_gen_regs(void *hal, HalEncTask *task)
{
    H265eV540cHalContext *ctx = (H265eV540cHalContext *)hal;
    HalEncTask *enc_task = task;
    H265eSyntax_new *syn = (H265eSyntax_new *)enc_task->syntax.data;
    H265eV540cRegSet *regs = ctx->regs;
    RK_U32 pic_width_align8, pic_height_align8;
    RK_S32 pic_wd32, pic_h32;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    hevc_vepu540c_control_cfg *reg_ctl = &regs->reg_ctl;
    hevc_vepu540c_base        *reg_base = &regs->reg_base;
    hevc_vepu540c_rc_roi *reg_klut = &regs->reg_rc_roi;

    hal_h265e_enter();
    pic_width_align8 = (syn->pp.pic_width + 7) & (~7);
    pic_height_align8 = (syn->pp.pic_height + 7) & (~7);
    pic_wd32 = (syn->pp.pic_width +  31) / 32;
    pic_h32 = (syn->pp.pic_height + 31) / 32;

    hal_h265e_dbg_simple("frame %d | type %d | start gen regs",
                         ctx->frame_cnt, ctx->frame_type);

    memset(regs, 0, sizeof(H265eV540cRegSet));

    reg_ctl->reg0004_enc_strt.lkt_num      = 0;
    reg_ctl->reg0004_enc_strt.vepu_cmd     = ctx->enc_mode;
    reg_ctl->reg0005_enc_clr.safe_clr      = 0x0;
    reg_ctl->reg0005_enc_clr.force_clr     = 0x0;

    reg_ctl->reg0008_int_en.enc_done_en        = 1;
    reg_ctl->reg0008_int_en.lkt_node_done_en   = 1;
    reg_ctl->reg0008_int_en.sclr_done_en       = 1;
    reg_ctl->reg0008_int_en.vslc_done_en       = 0;
    reg_ctl->reg0008_int_en.vbsf_oflw_en       = 1;
    reg_ctl->reg0008_int_en.vbuf_lens_en       = 1;
    reg_ctl->reg0008_int_en.enc_err_en         = 1;
    reg_ctl->reg0008_int_en.dvbm_fcfg_en       = 1;
    reg_ctl->reg0008_int_en.wdg_en             = 1;
    reg_ctl->reg0008_int_en.lkt_err_int_en     = 0;
    reg_ctl->reg0008_int_en.lkt_err_stop_en    = 1;
    reg_ctl->reg0008_int_en.lkt_force_stop_en  = 1;
    reg_ctl->reg0008_int_en.jslc_done_en       = 1;
    reg_ctl->reg0008_int_en.jbsf_oflw_en       = 1;
    reg_ctl->reg0008_int_en.jbuf_lens_en       = 1;
    reg_ctl->reg0008_int_en.dvbm_dcnt_en       = 1;

    reg_ctl->reg0012_dtrns_map.jpeg_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.src_bus_edin     = 0x0;
    reg_ctl->reg0012_dtrns_map.meiw_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.bsw_bus_edin     = 0x7;
    reg_ctl->reg0012_dtrns_map.lktr_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.roir_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.lktw_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.rec_nfbc_bus_edin   = 0x0;
    /* enable rdo clk gating */
    {
        RK_U32 *rdo_ckg = (RK_U32*)&reg_ctl->reg0022_rdo_ckg;

        *rdo_ckg = 0xffffffff;
    }
//   reg_ctl->reg0013_dtrns_cfg.dspr_otsd        = (ctx->frame_type == INTER_P_FRAME);
    reg_ctl->reg0013_dtrns_cfg.axi_brsp_cke     = 0x0;
    reg_ctl->reg0014_enc_wdg.vs_load_thd        = 0x1fffff;
    reg_ctl->reg0014_enc_wdg.rfp_load_thd       = 0xff;

    reg_ctl->reg0021_func_en.cke                = 1;
    reg_ctl->reg0021_func_en.resetn_hw_en       = 1;
    reg_ctl->reg0021_func_en.enc_done_tmvp_en   = 1;

    reg_base->reg0196_enc_rsl.pic_wd8_m1    = pic_width_align8 / 8 - 1;
    reg_base->reg0197_src_fill.pic_wfill    = (syn->pp.pic_width & 0x7)
                                              ? (8 - (syn->pp.pic_width & 0x7)) : 0;
    reg_base->reg0196_enc_rsl.pic_hd8_m1    = pic_height_align8 / 8 - 1;
    reg_base->reg0197_src_fill.pic_hfill    = (syn->pp.pic_height & 0x7)
                                              ? (8 - (syn->pp.pic_height & 0x7)) : 0;

    reg_base->reg0192_enc_pic.enc_stnd      = 1; //H265
    reg_base->reg0192_enc_pic.cur_frm_ref   = !syn->sp.non_reference_flag; //current frame will be refered
    reg_base->reg0192_enc_pic.bs_scp        = 1;
    reg_base->reg0192_enc_pic.log2_ctu_num  = mpp_ceil_log2(pic_wd32 * pic_h32);

    reg_base->reg0203_src_proc.src_mirr = 0;
    reg_base->reg0203_src_proc.src_rot  = 0;

    reg_klut->klut_ofst.chrm_klut_ofst = (ctx->frame_type == INTRA_FRAME) ? 6 :
                                         (ctx->cfg->tune.scene_mode == MPP_ENC_SCENE_MODE_IPC ? 9 : 6);
    reg_klut->klut_ofst.inter_chrm_dist_multi = 4;
    reg_base->reg0248_sao_cfg.sao_lambda_multi = 5;

    vepu540c_h265_set_me_regs(ctx, syn, reg_base);

    reg_base->reg0232_rdo_cfg.chrm_spcl   = 0;
    reg_base->reg0232_rdo_cfg.cu_inter_e    = 0x0092;
    reg_base->reg0232_rdo_cfg.cu_intra_e    = 0xe;
    reg_base->reg0232_rdo_cfg.lambda_qp_use_avg_cu16_flag = 1;
    reg_base->reg0232_rdo_cfg.yuvskip_calc_en = 1;
    reg_base->reg0232_rdo_cfg.atf_e = 1;
    reg_base->reg0232_rdo_cfg.atr_e = 1;

    if (syn->pp.num_long_term_ref_pics_sps) {
        reg_base->reg0232_rdo_cfg.ltm_col   = 0;
        reg_base->reg0232_rdo_cfg.ltm_idx0l0 = 1;
    } else {
        reg_base->reg0232_rdo_cfg.ltm_col   = 0;
        reg_base->reg0232_rdo_cfg.ltm_idx0l0 = 0;
    }

    reg_base->reg0232_rdo_cfg.ccwa_e = 1;
    reg_base->reg0232_rdo_cfg.scl_lst_sel = syn->pp.scaling_list_enabled_flag;
    {
        RK_U32 i_nal_type = 0;

        /* TODO: extend syn->frame_coding_type definition */
        if (ctx->frame_type == INTRA_FRAME) {
            /* reset ref pictures */
            i_nal_type    = NAL_IDR_W_RADL;
        } else if (ctx->frame_type == INTER_P_FRAME ) {
            i_nal_type    = NAL_TRAIL_R;
        } else {
            i_nal_type    = NAL_TRAIL_R;
        }
        reg_base->reg0236_synt_nal.nal_unit_type    = syn->sp.temporal_id ? NAL_TSA_R : i_nal_type;
    }

    vepu540c_h265_set_hw_address(ctx, reg_base, task);
    vepu540c_h265_set_pp_regs(regs, fmt, &ctx->cfg->prep);
    vepu540c_h265_set_rc_regs(ctx, regs, task);
    vepu540c_h265_set_slice_regs(syn, reg_base);
    vepu540c_h265_set_ref_regs(syn, reg_base);
    vepu540c_h265_set_patch_info(ctx->dev, syn, (Vepu541Fmt)fmt->format, enc_task);
    setup_vepu540c_ext_line_buf(ctx, ctx->regs);
    vepu540c_h265_set_split(regs, ctx->cfg, syn->pp.tiles_enabled_flag);

    /* ROI configure */
    if (ctx->roi_data)
        vepu540c_set_roi(&regs->reg_rc_roi.roi_cfg, ctx->roi_data,
                         ctx->cfg->prep.width, ctx->cfg->prep.height);
    /*paramet cfg*/
    vepu540c_h265_global_cfg_set(ctx, regs);

    ctx->frame_num++;

    hal_h265e_leave();
    return MPP_OK;
}